

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O0

double activityContributionMin(double coef,double *lb,double *ub)

{
  double *ub_local;
  double *lb_local;
  double coef_local;
  undefined8 local_8;
  
  if (0.0 <= coef) {
    if ((*lb != -INFINITY) || (NAN(*lb))) {
      local_8 = coef * *lb;
    }
    else {
      local_8 = -INFINITY;
    }
  }
  else if ((*ub != INFINITY) || (NAN(*ub))) {
    local_8 = coef * *ub;
  }
  else {
    local_8 = -INFINITY;
  }
  return local_8;
}

Assistant:

static double activityContributionMin(double coef, const double& lb,
                                      const double& ub) {
  if (coef < 0) {
    if (ub == kHighsInf) return -kHighsInf;

    return coef * ub;
  } else {
    if (lb == -kHighsInf) return -kHighsInf;

    return coef * lb;
  }
}